

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O2

mdns_string_pair_t *
mdns_get_next_substring
          (mdns_string_pair_t *__return_storage_ptr__,void *rawdata,size_t size,size_t offset)

{
  byte bVar1;
  size_t sVar2;
  
  *(undefined8 *)&__return_storage_ptr__->ref = 0;
  __return_storage_ptr__->offset = 0xffffffffffffffff;
  __return_storage_ptr__->length = 0;
  bVar1 = *(byte *)((long)rawdata + offset);
  sVar2 = (size_t)bVar1;
  if (sVar2 == 0) {
    __return_storage_ptr__->offset = offset;
    return __return_storage_ptr__;
  }
  if (0xbf < bVar1) {
    if (size < offset + 2) {
      return __return_storage_ptr__;
    }
    offset = (ulong)*(byte *)((long)rawdata + offset + 1) | (ulong)((bVar1 & 0x3f) << 8);
    if (size <= offset) {
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->ref = 1;
    sVar2 = (size_t)*(byte *)((long)rawdata + offset);
  }
  if (offset + sVar2 + 1 <= size) {
    __return_storage_ptr__->offset = offset + 1;
    __return_storage_ptr__->length = sVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

mdns_string_pair_t
mdns_get_next_substring(const void* rawdata, size_t size, size_t offset) {
	const uint8_t* buffer = (const uint8_t*)rawdata;
	mdns_string_pair_t pair = {MDNS_INVALID_POS, 0, 0};
	if (!buffer[offset]) {
		pair.offset = offset;
		return pair;
	}
	if (mdns_is_string_ref(buffer[offset])) {
		if (size < offset + 2)
			return pair;

		offset = (((size_t)(0x3f & buffer[offset]) << 8) | (size_t)buffer[offset + 1]);
		if (offset >= size)
			return pair;

		pair.ref = 1;
	}

	size_t length = (size_t)buffer[offset++];
	if (size < offset + length)
		return pair;

	pair.offset = offset;
	pair.length = length;

	return pair;
}